

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cache.cc
# Opt level: O1

void __thiscall leveldb::TableCache::~TableCache(TableCache *this)

{
  long lVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->cache_ != (Cache *)0x0) {
    (*this->cache_->_vptr_Cache[1])();
  }
  pcVar2 = (this->dbname_)._M_dataplus._M_p;
  paVar3 = &(this->dbname_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar3) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  __stack_chk_fail();
}

Assistant:

TableCache::~TableCache() { delete cache_; }